

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Edge.hpp
# Opt level: O3

bool __thiscall Edge::angleInRange(Edge *this,double angle,int k,int k_1)

{
  iterator *this_00;
  double dVar1;
  double dVar2;
  bool bVar3;
  reference pMVar4;
  double dVar5;
  double dVar6;
  
  std::
  deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::_M_range_check(&this->
                    super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   ,(long)k);
  this_00 = &(this->
             super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             ).
             super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             ._M_impl.super__Deque_impl_data._M_start;
  pMVar4 = std::
           _Deque_iterator<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_*>
           ::operator[](this_00,(long)k);
  dVar1 = (pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
          array[2];
  std::
  deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::_M_range_check(&this->
                    super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   ,(long)k_1);
  pMVar4 = std::
           _Deque_iterator<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_*>
           ::operator[](this_00,(long)k_1);
  dVar2 = (pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
          array[2];
  dVar6 = dVar1 + 1e-06;
  dVar5 = dVar2 + -1e-06;
  if (dVar1 <= dVar2) {
    bVar3 = dVar6 < angle && angle < dVar5;
  }
  else {
    bVar3 = dVar6 < angle || angle < dVar5;
  }
  return (bool)(-bVar3 & 1);
}

Assistant:

bool angleInRange(double angle, int k, int k_1) const {
        const double k_ang = this->at(k).z(), k_ang_1 = this->at(k_1).z();
        if (k_ang > k_ang_1)        // 跨越奇异
            return (angle > k_ang + margin) || (angle < k_ang_1 - margin);
        else
            return (angle > k_ang + margin) && (angle < k_ang_1 - margin);
    }